

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void testing::internal::
     MatcherBase<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>::
     ValuePolicy<testing::internal::EqMatcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>>,false>
     ::
     Init<testing::internal::EqMatcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>
               (MatcherBase<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
                *m,EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   *arg)

{
  pointer pcVar1;
  uint64_t uVar2;
  undefined4 *puVar3;
  
  puVar3 = (undefined4 *)operator_new(0x38);
  *puVar3 = 1;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  pcVar1 = (arg->
           super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
           ).rhs_.first._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar3 + 2),pcVar1,
             pcVar1 + (arg->
                      super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
                      ).rhs_.first._M_string_length);
  uVar2 = (arg->
          super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
          ).rhs_.second.size;
  *(value_type *)(puVar3 + 10) =
       (arg->
       super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
       ).rhs_.second.addr.a_.a_;
  *(uint64_t *)(puVar3 + 0xc) = uVar2;
  (m->buffer_).ptr = puVar3;
  return;
}

Assistant:

static void Init(MatcherBase& m, Arg&& arg) {
      m.buffer_.shared = new Shared(std::forward<Arg>(arg));
    }